

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::Options(Options *this,Options *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  string *default_value;
  Options *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffed8;
  InternalMetadataWithArena *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  string *in_stack_fffffffffffffef0;
  ArenaStringPtr *in_stack_fffffffffffffef8;
  ArenaStringPtr in_stack_ffffffffffffff00;
  
  google::protobuf::Message::Message((Message *)in_stack_fffffffffffffee0);
  *in_RDI = &PTR__Options_00918700;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  google::protobuf::internal::CachedSize::CachedSize((CachedSize *)0x1c4824);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffef0,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffef0,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffef0,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::RepeatedPtrField
            ((RepeatedPtrField<bloaty::CustomDataSource> *)in_stack_fffffffffffffef0,
             (RepeatedPtrField<bloaty::CustomDataSource> *)
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffef0,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffef0,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (in_stack_fffffffffffffee0,(UnknownFieldSet *)in_stack_fffffffffffffed8);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)(in_RDI + 0x15),psVar2);
  bVar1 = _internal_has_disassemble_function(in_RSI);
  if (bVar1) {
    in_stack_ffffffffffffff00.ptr_ = (string *)(in_RDI + 0x15);
    google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
  }
  psVar2 = (string *)(in_RDI + 0x16);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)psVar2,default_value);
  bVar1 = _internal_has_source_filter(in_RSI);
  if (bVar1) {
    google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              ((ArenaStringPtr *)default_value,psVar2,in_stack_ffffffffffffff00);
  }
  memcpy(in_RDI + 0x17,&in_RSI->demangle_,0x28);
  return;
}

Assistant:

Options::Options(const Options& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      filename_(from.filename_),
      base_filename_(from.base_filename_),
      data_source_(from.data_source_),
      custom_data_source_(from.custom_data_source_),
      debug_filename_(from.debug_filename_),
      source_map_(from.source_map_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  disassemble_function_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_disassemble_function()) {
    disassemble_function_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.disassemble_function_);
  }
  source_filter_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_source_filter()) {
    source_filter_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.source_filter_);
  }
  ::memcpy(&demangle_, &from.demangle_,
    static_cast<size_t>(reinterpret_cast<char*>(&max_rows_per_level_) -
    reinterpret_cast<char*>(&demangle_)) + sizeof(max_rows_per_level_));
  // @@protoc_insertion_point(copy_constructor:bloaty.Options)
}